

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::SerializedResourceSignatureImpl::IsCompatible
          (SerializedResourceSignatureImpl *this,SerializedResourceSignatureImpl *Rhs,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags)

{
  DeviceType Type;
  int iVar1;
  IPipelineResourceSignature *pIVar2;
  IPipelineResourceSignature *pIVar3;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceFlag;
  bool bVar4;
  
  if (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE) {
    do {
      DeviceFlag = -DeviceFlags & DeviceFlags;
      Type = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
      pIVar2 = GetDeviceSignature(this,Type);
      pIVar3 = GetDeviceSignature(Rhs,Type);
      if (((pIVar2 == (IPipelineResourceSignature *)0x0) ==
           (pIVar3 != (IPipelineResourceSignature *)0x0)) ||
         ((pIVar2 != (IPipelineResourceSignature *)0x0 &&
           pIVar3 != (IPipelineResourceSignature *)0x0 &&
          (iVar1 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[0xf])(pIVar2,pIVar3),
          (char)iVar1 == '\0')))) {
        return false;
      }
      bVar4 = DeviceFlag != DeviceFlags;
      DeviceFlags = DeviceFlag ^ DeviceFlags;
    } while (bVar4);
  }
  return true;
}

Assistant:

bool SerializedResourceSignatureImpl::IsCompatible(const SerializedResourceSignatureImpl& Rhs, ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags) const
{
    while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
    {
        const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
        const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

        const auto* pPRS0 = GetDeviceSignature(ArchiveDeviceType);
        const auto* pPRS1 = Rhs.GetDeviceSignature(ArchiveDeviceType);
        if ((pPRS0 == nullptr) != (pPRS1 == nullptr))
            return false;

        if ((pPRS0 != nullptr) && (pPRS1 != nullptr) && !pPRS0->IsCompatibleWith(pPRS1))
            return false;
    }
    return true;
}